

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.h
# Opt level: O0

void Assimp::BaseImporter::CopyVector<aiMesh*>
               (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *vec,aiMesh ***out,uint *outLength)

{
  size_type sVar1;
  ulong uVar2;
  aiMesh **ppaVar3;
  iterator __first1;
  iterator __last1;
  uint *outLength_local;
  aiMesh ***out_local;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *vec_local;
  
  sVar1 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(vec);
  *outLength = (uint)sVar1;
  if (*outLength != 0) {
    uVar2 = SUB168(ZEXT416(*outLength) * ZEXT816(8),0);
    if (SUB168(ZEXT416(*outLength) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppaVar3 = (aiMesh **)operator_new__(uVar2);
    *out = ppaVar3;
    __first1 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(vec);
    __last1 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(vec);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __first1._M_current,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __last1._M_current,*out);
  }
  return;
}

Assistant:

AI_FORCE_INLINE
    static void CopyVector(
        std::vector<T>& vec,
        T*& out,
        unsigned int& outLength)
    {
        outLength = unsigned(vec.size());
        if (outLength) {
            out = new T[outLength];
            std::swap_ranges(vec.begin(), vec.end(), out);
        }
    }